

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O0

void phosg::expect_raises_fn<std::out_of_range>(char *file,uint64_t line,function<void_()> *fn)

{
  out_of_range *anon_var_0;
  string msg;
  exception *e;
  function<void_()> *fn_local;
  uint64_t line_local;
  char *file_local;
  
  ::std::function<void_()>::operator()(fn);
  expect_generic(false,"expected exception, but none raised",file,line);
  return;
}

Assistant:

void expect_raises_fn(const char* file, uint64_t line, std::function<void()> fn) {
  try {
    fn();
    expect_generic(false, "expected exception, but none raised", file, line);
  } catch (const ExcT&) {
    return;
  } catch (const std::exception& e) {
    std::string msg = string_printf("incorrect exception type raised (what: %s)", e.what());
    expect_generic(false, msg.c_str(), file, line);
  } catch (...) {
    // TODO: It'd be nice to show SOMETHING about the thrown exception here,
    // but it's probably pretty rare to catch something that isn't a
    // std::exception anyway.
    expect_generic(false, "incorrect exception type raised", file, line);
  }
}